

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

int xmlDocFormatDump(FILE *f,xmlDocPtr cur,int format)

{
  int iVar1;
  int local_d8;
  int res;
  int options;
  int ret;
  xmlCharEncodingHandlerPtr handler;
  char *encoding;
  xmlOutputBufferPtr buf;
  xmlSaveCtxt ctxt;
  int format_local;
  xmlDocPtr cur_local;
  FILE *f_local;
  
  _options = (xmlCharEncodingHandlerPtr)0x0;
  if (cur == (xmlDocPtr)0x0) {
    f_local._4_4_ = -1;
  }
  else {
    handler = (xmlCharEncodingHandlerPtr)cur->encoding;
    ctxt.escape._4_4_ = format;
    if ((handler != (xmlCharEncodingHandlerPtr)0x0) &&
       (iVar1 = xmlOpenCharEncodingHandler((char *)handler,1,(xmlCharEncodingHandler **)&options),
       iVar1 != 0)) {
      (*xmlFree)(cur->encoding);
      handler = (xmlCharEncodingHandlerPtr)0x0;
    }
    encoding = (char *)xmlOutputBufferCreateFile(f,_options);
    if ((xmlOutputBufferPtr)encoding == (xmlOutputBufferPtr)0x0) {
      f_local._4_4_ = -1;
    }
    else {
      memset(&buf,0,0x90);
      ctxt.handler = (xmlCharEncodingHandlerPtr)encoding;
      ctxt.buf._4_4_ = 0;
      ctxt.filename = (xmlChar *)handler;
      local_d8 = 0x20;
      if (ctxt.escape._4_4_ != 0) {
        local_d8 = 0x21;
      }
      xmlSaveCtxtInit((xmlSaveCtxtPtr)&buf,local_d8);
      xmlDocContentDumpOutput((xmlSaveCtxtPtr)&buf,cur);
      f_local._4_4_ = xmlOutputBufferClose((xmlOutputBufferPtr)encoding);
    }
  }
  return f_local._4_4_;
}

Assistant:

int
xmlDocFormatDump(FILE *f, xmlDocPtr cur, int format) {
    xmlSaveCtxt ctxt;
    xmlOutputBufferPtr buf;
    const char * encoding;
    xmlCharEncodingHandlerPtr handler = NULL;
    int ret;
    int options;

    if (cur == NULL) {
	return(-1);
    }
    encoding = (const char *) cur->encoding;

    if (encoding != NULL) {
        int res;

	res = xmlOpenCharEncodingHandler(encoding, /* output */ 1, &handler);
	if (res != XML_ERR_OK) {
	    xmlFree((char *) cur->encoding);
	    encoding = NULL;
	}
    }
    buf = xmlOutputBufferCreateFile(f, handler);
    if (buf == NULL) return(-1);
    memset(&ctxt, 0, sizeof(ctxt));
    ctxt.buf = buf;
    ctxt.level = 0;
    ctxt.encoding = (const xmlChar *) encoding;

    options = XML_SAVE_AS_XML;
    if (format)
        options |= XML_SAVE_FORMAT;
    xmlSaveCtxtInit(&ctxt, options);

    xmlDocContentDumpOutput(&ctxt, cur);

    ret = xmlOutputBufferClose(buf);
    return(ret);
}